

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinEsop.c
# Opt level: O0

int Min_EsopAddCubeInt(Min_Man_t *p,Min_Cube_t *pCube)

{
  int iVar1;
  Min_Cube_t **local_30;
  Min_Cube_t **ppPrev;
  Min_Cube_t *pThis;
  Min_Cube_t *pCube_local;
  Min_Man_t *p_local;
  
  local_30 = p->ppStore + (*(uint *)&pCube->field_0x8 >> 0x16);
  for (ppPrev = &p->ppStore[*(uint *)&pCube->field_0x8 >> 0x16]->pNext; ppPrev != (Min_Cube_t **)0x0
      ; ppPrev = &(*ppPrev)->pNext) {
    iVar1 = Min_CubesAreEqual(pCube,(Min_Cube_t *)ppPrev);
    if (iVar1 != 0) {
      *local_30 = *ppPrev;
      Min_CubeRecycle(p,pCube);
      Min_CubeRecycle(p,(Min_Cube_t *)ppPrev);
      p->nCubes = p->nCubes + -1;
      return 0;
    }
    local_30 = ppPrev;
  }
  if (*(uint *)&pCube->field_0x8 >> 0x16 < (*(uint *)&pCube->field_0x8 & 0x3ff)) {
    local_30 = p->ppStore + (int)((*(uint *)&pCube->field_0x8 >> 0x16) + 1);
    for (ppPrev = &p->ppStore[(int)((*(uint *)&pCube->field_0x8 >> 0x16) + 1)]->pNext;
        ppPrev != (Min_Cube_t **)0x0; ppPrev = &(*ppPrev)->pNext) {
      iVar1 = Min_CubesDistOne(pCube,(Min_Cube_t *)ppPrev,p->pTemp);
      if (iVar1 != 0) {
        *local_30 = *ppPrev;
        Min_CubesTransform(pCube,(Min_Cube_t *)ppPrev,p->pTemp);
        *(uint *)&pCube->field_0x8 =
             *(uint *)&pCube->field_0x8 & 0x3fffff |
             ((*(uint *)&pCube->field_0x8 >> 0x16) + 1) * 0x400000;
        Min_CubeRecycle(p,(Min_Cube_t *)ppPrev);
        p->nCubes = p->nCubes + -1;
        return 1;
      }
      local_30 = ppPrev;
    }
  }
  local_30 = p->ppStore + (*(uint *)&pCube->field_0x8 >> 0x16);
  for (ppPrev = &p->ppStore[*(uint *)&pCube->field_0x8 >> 0x16]->pNext; ppPrev != (Min_Cube_t **)0x0
      ; ppPrev = &(*ppPrev)->pNext) {
    iVar1 = Min_CubesDistOne(pCube,(Min_Cube_t *)ppPrev,p->pTemp);
    if (iVar1 != 0) {
      *local_30 = *ppPrev;
      Min_CubesTransform(pCube,(Min_Cube_t *)ppPrev,p->pTemp);
      *(uint *)&pCube->field_0x8 =
           *(uint *)&pCube->field_0x8 & 0x3fffff |
           ((*(uint *)&pCube->field_0x8 >> 0x16) - 1) * 0x400000;
      Min_CubeRecycle(p,(Min_Cube_t *)ppPrev);
      p->nCubes = p->nCubes + -1;
      return 1;
    }
    local_30 = ppPrev;
  }
  if (*(uint *)&pCube->field_0x8 >> 0x16 != 0) {
    local_30 = p->ppStore + (int)((*(uint *)&pCube->field_0x8 >> 0x16) - 1);
    for (ppPrev = &p->ppStore[(int)((*(uint *)&pCube->field_0x8 >> 0x16) - 1)]->pNext;
        ppPrev != (Min_Cube_t **)0x0; ppPrev = &(*ppPrev)->pNext) {
      iVar1 = Min_CubesDistOne(pCube,(Min_Cube_t *)ppPrev,p->pTemp);
      if (iVar1 != 0) {
        *local_30 = *ppPrev;
        Min_CubesTransform(pCube,(Min_Cube_t *)ppPrev,p->pTemp);
        Min_CubeRecycle(p,(Min_Cube_t *)ppPrev);
        p->nCubes = p->nCubes + -1;
        return 1;
      }
      local_30 = ppPrev;
    }
  }
  pCube->pNext = p->ppStore[*(uint *)&pCube->field_0x8 >> 0x16];
  p->ppStore[*(uint *)&pCube->field_0x8 >> 0x16] = pCube;
  p->nCubes = p->nCubes + 1;
  return 0;
}

Assistant:

int Min_EsopAddCubeInt( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis, ** ppPrev;
    // try to find the identical cube
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubeRecycle( p, pCube );
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 0;
        }
    }
    // find a distance-1 cube if it exists
    if ( pCube->nLits < pCube->nVars )
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits+1], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            pCube->nLits++;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            pCube->nLits--;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    if ( pCube->nLits > 0 )
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits-1], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    // add the cube
    pCube->pNext = p->ppStore[pCube->nLits];
    p->ppStore[pCube->nLits] = pCube;
    p->nCubes++;
    return 0;
}